

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O0

bool __thiscall
glcts::anon_unknown_0::SACSubcaseBase::CheckUniform
          (SACSubcaseBase *this,GLuint prog,GLchar *uniform_name,GLuint uniform_index,
          GLint uniform_type,GLint uniform_size,GLint uniform_offset,GLint uniform_array_stride)

{
  int iVar1;
  size_t sVar2;
  uint local_6c;
  GLchar local_68 [4];
  GLint param;
  GLchar name [32];
  uint local_40;
  GLenum type;
  GLint size;
  GLsizei length;
  GLsizei uniform_length;
  GLuint index;
  uint uStack_28;
  bool ok;
  GLint uniform_size_local;
  GLint uniform_type_local;
  GLuint uniform_index_local;
  GLchar *uniform_name_local;
  SACSubcaseBase *pSStack_10;
  GLuint prog_local;
  SACSubcaseBase *this_local;
  
  uniform_length._3_1_ = 1;
  index = uniform_size;
  uStack_28 = uniform_type;
  uniform_size_local = uniform_index;
  _uniform_type_local = uniform_name;
  uniform_name_local._4_4_ = prog;
  pSStack_10 = this;
  glu::CallLogWrapper::glGetUniformIndices
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,prog,1,
             (GLchar **)&uniform_type_local,(GLuint *)&length);
  if (length != uniform_size_local) {
    anon_unknown_0::Output
              ("Uniform: %s: Bad index returned by glGetUniformIndices.\n",_uniform_type_local);
    uniform_length._3_1_ = 0;
  }
  sVar2 = strlen(_uniform_type_local);
  size = (GLint)sVar2;
  glu::CallLogWrapper::glGetProgramResourceName
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,
             uniform_name_local._4_4_,0x92e1,uniform_size_local,0x20,(GLsizei *)&type,local_68);
  if (type != size) {
    anon_unknown_0::Output
              ("Uniform: %s: Length is %d should be %d.\n",_uniform_type_local,(ulong)type,
               (ulong)(uint)size);
    uniform_length._3_1_ = 0;
  }
  glu::CallLogWrapper::glGetActiveUniform
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,
             uniform_name_local._4_4_,uniform_size_local,0x20,(GLsizei *)&type,(GLint *)&local_40,
             (GLenum *)(name + 0x1c),local_68);
  iVar1 = strcmp(local_68,_uniform_type_local);
  if (iVar1 != 0) {
    anon_unknown_0::Output
              ("Uniform: %s: Bad name returned by glGetActiveUniform.\n",_uniform_type_local);
    uniform_length._3_1_ = 0;
  }
  if (type != size) {
    anon_unknown_0::Output
              ("Uniform: %s: Length is %d should be %d.\n",_uniform_type_local,(ulong)type,
               (ulong)(uint)size);
    uniform_length._3_1_ = 0;
  }
  if (local_40 != index) {
    anon_unknown_0::Output
              ("Uniform: %s: Size is %d should be %d.\n",_uniform_type_local,(ulong)local_40,
               (ulong)index);
    uniform_length._3_1_ = 0;
  }
  if (name._28_4_ != uStack_28) {
    anon_unknown_0::Output
              ("Uniform: %s: Type is %d should be %d.\n",_uniform_type_local,
               (ulong)(uint)name._28_4_,(ulong)uStack_28);
    uniform_length._3_1_ = 0;
  }
  glu::CallLogWrapper::glGetActiveUniformsiv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,
             uniform_name_local._4_4_,1,(GLuint *)&uniform_size_local,0x8a37,(GLint *)&local_6c);
  if (local_6c != uStack_28) {
    anon_unknown_0::Output
              ("Uniform: %s: Type is %d should be %d.\n",_uniform_type_local,(ulong)local_6c,
               (ulong)uStack_28);
    uniform_length._3_1_ = 0;
  }
  glu::CallLogWrapper::glGetActiveUniformsiv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,
             uniform_name_local._4_4_,1,(GLuint *)&uniform_size_local,0x8a38,(GLint *)&local_6c);
  if (local_6c != index) {
    anon_unknown_0::Output
              ("Uniform: %s: GL_UNIFORM_SIZE is %d should be %d.\n",_uniform_type_local,
               (ulong)local_6c,(ulong)index);
    uniform_length._3_1_ = 0;
  }
  glu::CallLogWrapper::glGetActiveUniformsiv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,
             uniform_name_local._4_4_,1,(GLuint *)&uniform_size_local,0x8a39,(GLint *)&local_6c);
  if (local_6c != size + 1U) {
    anon_unknown_0::Output
              ("Uniform: %s: GL_UNIFORM_NAME_LENGTH is %d should be %d.\n",_uniform_type_local,
               (ulong)local_6c,(ulong)(size + 1));
    uniform_length._3_1_ = 0;
  }
  glu::CallLogWrapper::glGetActiveUniformsiv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,
             uniform_name_local._4_4_,1,(GLuint *)&uniform_size_local,0x8a3a,(GLint *)&local_6c);
  if (local_6c != 0xffffffff) {
    anon_unknown_0::Output
              ("Uniform: %s: GL_UNIFORM_BLOCK_INDEX should be -1.\n",_uniform_type_local);
    uniform_length._3_1_ = 0;
  }
  glu::CallLogWrapper::glGetActiveUniformsiv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,
             uniform_name_local._4_4_,1,(GLuint *)&uniform_size_local,0x8a3b,(GLint *)&local_6c);
  if (local_6c != uniform_offset) {
    anon_unknown_0::Output
              ("Uniform: %s: GL_UNIFORM_OFFSET is %d should be %d.\n",_uniform_type_local,
               (ulong)local_6c,(ulong)(uint)uniform_offset);
    uniform_length._3_1_ = 0;
  }
  glu::CallLogWrapper::glGetActiveUniformsiv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,
             uniform_name_local._4_4_,1,(GLuint *)&uniform_size_local,0x8a3c,(GLint *)&local_6c);
  if (local_6c != uniform_array_stride) {
    anon_unknown_0::Output
              ("Uniform: %s: GL_UNIFORM_ARRAY_STRIDE is %d should be %d.\n",_uniform_type_local,
               (ulong)local_6c,(ulong)(uint)uniform_array_stride);
    uniform_length._3_1_ = 0;
  }
  glu::CallLogWrapper::glGetActiveUniformsiv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,
             uniform_name_local._4_4_,1,(GLuint *)&uniform_size_local,0x8a3d,(GLint *)&local_6c);
  if (local_6c != 0) {
    anon_unknown_0::Output
              ("Uniform: %s: GL_UNIFORM_MATRIX_STRIDE should be 0 is %d.\n",_uniform_type_local,
               (ulong)local_6c);
    uniform_length._3_1_ = 0;
  }
  glu::CallLogWrapper::glGetActiveUniformsiv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,
             uniform_name_local._4_4_,1,(GLuint *)&uniform_size_local,0x8a3e,(GLint *)&local_6c);
  if (local_6c != 0) {
    anon_unknown_0::Output
              ("Uniform: %s: GL_UNIFORM_IS_ROW_MAJOR should be 0 is %d.\n",_uniform_type_local,
               (ulong)local_6c);
    uniform_length._3_1_ = 0;
  }
  return (bool)(uniform_length._3_1_ & 1);
}

Assistant:

bool CheckUniform(GLuint prog, const GLchar* uniform_name, GLuint uniform_index, GLint uniform_type,
					  GLint uniform_size, GLint uniform_offset, GLint uniform_array_stride)
	{
		bool ok = true;

		GLuint index;
		glGetUniformIndices(prog, 1, &uniform_name, &index);
		if (index != uniform_index)
		{
			Output("Uniform: %s: Bad index returned by glGetUniformIndices.\n", uniform_name);
			ok = false;
		}

		const GLsizei uniform_length = static_cast<GLsizei>(strlen(uniform_name));

		GLsizei length;
		GLint   size;
		GLenum  type;
		GLchar  name[32];

		glGetProgramResourceName(prog, GL_UNIFORM, uniform_index, sizeof(name), &length, name);
		if (length != uniform_length)
		{
			Output("Uniform: %s: Length is %d should be %d.\n", uniform_name, length, uniform_length);
			ok = false;
		}
		glGetActiveUniform(prog, uniform_index, sizeof(name), &length, &size, &type, name);
		if (strcmp(name, uniform_name))
		{
			Output("Uniform: %s: Bad name returned by glGetActiveUniform.\n", uniform_name);
			ok = false;
		}
		if (length != uniform_length)
		{
			Output("Uniform: %s: Length is %d should be %d.\n", uniform_name, length, uniform_length);
			ok = false;
		}
		if (size != uniform_size)
		{
			Output("Uniform: %s: Size is %d should be %d.\n", uniform_name, size, uniform_size);
			ok = false;
		}
		if (type != static_cast<GLenum>(uniform_type))
		{
			Output("Uniform: %s: Type is %d should be %d.\n", uniform_name, type, uniform_type);
			ok = false;
		}

		GLint param;
		glGetActiveUniformsiv(prog, 1, &uniform_index, GL_UNIFORM_TYPE, &param);
		if (param != uniform_type)
		{
			Output("Uniform: %s: Type is %d should be %d.\n", uniform_name, param, uniform_type);
			ok = false;
		}
		glGetActiveUniformsiv(prog, 1, &uniform_index, GL_UNIFORM_SIZE, &param);
		if (param != uniform_size)
		{
			Output("Uniform: %s: GL_UNIFORM_SIZE is %d should be %d.\n", uniform_name, param, uniform_size);
			ok = false;
		}
		glGetActiveUniformsiv(prog, 1, &uniform_index, GL_UNIFORM_NAME_LENGTH, &param);
		if (param != (uniform_length + 1))
		{
			Output("Uniform: %s: GL_UNIFORM_NAME_LENGTH is %d should be %d.\n", uniform_name, param,
				   uniform_length + 1);
			ok = false;
		}
		glGetActiveUniformsiv(prog, 1, &uniform_index, GL_UNIFORM_BLOCK_INDEX, &param);
		if (param != -1)
		{
			Output("Uniform: %s: GL_UNIFORM_BLOCK_INDEX should be -1.\n", uniform_name);
			ok = false;
		}
		glGetActiveUniformsiv(prog, 1, &uniform_index, GL_UNIFORM_OFFSET, &param);
		if (param != uniform_offset)
		{
			Output("Uniform: %s: GL_UNIFORM_OFFSET is %d should be %d.\n", uniform_name, param, uniform_offset);
			ok = false;
		}
		glGetActiveUniformsiv(prog, 1, &uniform_index, GL_UNIFORM_ARRAY_STRIDE, &param);
		if (param != uniform_array_stride)
		{
			Output("Uniform: %s: GL_UNIFORM_ARRAY_STRIDE is %d should be %d.\n", uniform_name, param,
				   uniform_array_stride);
			ok = false;
		}
		glGetActiveUniformsiv(prog, 1, &uniform_index, GL_UNIFORM_MATRIX_STRIDE, &param);
		if (param != 0)
		{
			Output("Uniform: %s: GL_UNIFORM_MATRIX_STRIDE should be 0 is %d.\n", uniform_name, param);
			ok = false;
		}
		glGetActiveUniformsiv(prog, 1, &uniform_index, GL_UNIFORM_IS_ROW_MAJOR, &param);
		if (param != 0)
		{
			Output("Uniform: %s: GL_UNIFORM_IS_ROW_MAJOR should be 0 is %d.\n", uniform_name, param);
			ok = false;
		}

		return ok;
	}